

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O3

bool MatchLabelsAgainstFilterRE
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *labels,vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_>
                        *expressions)

{
  pointer pbVar1;
  bool bVar2;
  const_iterator __end1;
  RegularExpression *in_RDX;
  string *l;
  pointer pbVar3;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  RegularExpression *re;
  RegularExpressionMatch match;
  RegularExpressionMatch RStack_238;
  
  if ((RegularExpression *)expressions != in_RDX) {
    do {
      memset(&RStack_238,0,0x208);
      pbVar3 = (labels->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      pbVar1 = (labels->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      while( true ) {
        if (pbVar3 == pbVar1) {
          return false;
        }
        bVar2 = cmsys::RegularExpression::find
                          ((RegularExpression *)expressions,(pbVar3->_M_dataplus)._M_p,&RStack_238);
        if (bVar2) break;
        pbVar3 = pbVar3 + 1;
      }
      expressions = (vector<cmsys::RegularExpression,_std::allocator<cmsys::RegularExpression>_> *)
                    ((long)expressions + 0x230);
    } while ((RegularExpression *)expressions != in_RDX);
  }
  return true;
}

Assistant:

static bool MatchLabelsAgainstFilterRE(
  const std::vector<std::string>& labels,
  const std::vector<cmsys::RegularExpression>& expressions)
{
  for (const auto& re : expressions) {
    // check to see if the label regular expression matches
    bool found = false; // assume it does not match
    cmsys::RegularExpressionMatch match;
    // loop over all labels and look for match
    for (std::string const& l : labels) {
      if (re.find(l.c_str(), match)) {
        found = true;
        break;
      }
    }
    // if no match was found, exclude the test
    if (!found) {
      return false;
    }
  }
  return true;
}